

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

magic_realm * class_magic_realms(player_class *c,int *count)

{
  class_book_conflict *pcVar1;
  bool bVar2;
  int iVar3;
  magic_realm *__dest;
  _Bool found;
  class_book_conflict *book;
  magic_realm *r_test;
  magic_realm *r;
  wchar_t i;
  int *count_local;
  player_class *c_local;
  
  r_test = (magic_realm *)mem_zalloc(0x38);
  *count = 0;
  if ((c->magic).total_spells == 0) {
    mem_free(r_test);
    c_local = (player_class *)0x0;
  }
  else {
    for (r._4_4_ = 0; r._4_4_ < (c->magic).num_books; r._4_4_ = r._4_4_ + 1) {
      book = (class_book_conflict *)r_test;
      pcVar1 = (c->magic).books;
      bVar2 = false;
      if (r_test->name == (char *)0x0) {
        memcpy(r_test,pcVar1[r._4_4_].realm,0x38);
        r_test->next = (magic_realm *)0x0;
        *count = *count + 1;
      }
      else {
        for (; book != (class_book_conflict *)0x0; book = *(class_book_conflict **)book) {
          iVar3 = strcmp((char *)book->realm,(pcVar1[r._4_4_].realm)->name);
          if (iVar3 == 0) {
            bVar2 = true;
          }
        }
        if (!bVar2) {
          __dest = (magic_realm *)mem_zalloc(0x38);
          memcpy(__dest,pcVar1[r._4_4_].realm,0x38);
          __dest->next = r_test;
          *count = *count + 1;
          r_test = __dest;
        }
      }
    }
    c_local = (player_class *)r_test;
  }
  return (magic_realm *)c_local;
}

Assistant:

struct magic_realm *class_magic_realms(const struct player_class *c, int *count)
{
	int i;
	struct magic_realm *r = mem_zalloc(sizeof(struct magic_realm));

	*count = 0;

	if (!c->magic.total_spells) {
		mem_free(r);
		return NULL;
	}

	for (i = 0; i < c->magic.num_books; i++) {
		struct magic_realm *r_test = r;
		struct class_book *book = &c->magic.books[i];
		bool found = false;

		/* Test for first realm */
		if (r->name == NULL) {
			memcpy(r, book->realm, sizeof(struct magic_realm));
			r->next = NULL;
			(*count)++;
			continue;
		}

		/* Test for already recorded */
		while (r_test) {
			if (streq(r_test->name, book->realm->name)) {
				found = true;
			}
			r_test = r_test->next;
		}
		if (found) continue;

		/* Add it */
		r_test = mem_zalloc(sizeof(struct magic_realm));
		memcpy(r_test, book->realm, sizeof(struct magic_realm));
		r_test->next = r;
		r = r_test;
		(*count)++;
	}

	return r;
}